

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::FormatListFileStack_abi_cxx11_(string *__return_storage_ptr__,cmMakefile *this)

{
  pointer pbVar1;
  long lVar2;
  pointer pbVar3;
  ostringstream tmp;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pbVar1 = (this->ListFileStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->ListFileStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar3 - (long)pbVar1 != 0) {
    lVar2 = (long)pbVar3 - (long)pbVar1 >> 5;
    do {
      if (lVar2 != (long)(this->ListFileStack).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) {
        std::operator<<(&local_1a8,"\n                ");
      }
      std::operator<<(&local_1a8,"[");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::operator<<(&local_1a8,"]\t");
      pbVar3 = pbVar3 + -1;
      std::operator<<(&local_1a8,(string *)pbVar3);
      lVar2 = lVar2 + -1;
      pbVar1 = (this->ListFileStack).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (pbVar3 != pbVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::FormatListFileStack() const
{
  std::ostringstream tmp;
  size_t depth = this->ListFileStack.size();
  if (depth > 0)
    {
    std::vector<std::string>::const_iterator it = this->ListFileStack.end();
    do
      {
      if (depth != this->ListFileStack.size())
        {
        tmp << "\n                ";
        }
      --it;
      tmp << "[";
      tmp << depth;
      tmp << "]\t";
      tmp << *it;
      depth--;
      }
    while (it != this->ListFileStack.begin());
    }
  return tmp.str();
}